

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O0

void __thiscall QFramePrivate::updateStyledFrameWidths(QFramePrivate *this)

{
  short sVar1;
  int iVar3;
  QFrame *pQVar4;
  QStyle *pQVar5;
  short *psVar6;
  short *b;
  QFramePrivate *in_RDI;
  long in_FS_OFFSET;
  QFrame *q;
  QRect cr;
  QStyleOptionFrame opt;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  int iVar2;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x49dfc3);
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x1a0))(pQVar4,&local_58);
  pQVar5 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  (**(code **)(*(long *)pQVar5 + 0xc0))(pQVar5,0x33,&local_58,pQVar4);
  iVar2 = QRect::left((QRect *)0x49e026);
  sVar1 = (short)iVar2;
  iVar2 = QRect::left((QRect *)0x49e034);
  in_RDI->leftFrameWidth = sVar1 - (short)iVar2;
  iVar2 = QRect::top((QRect *)0x49e061);
  iVar3 = QRect::top((QRect *)0x49e06f);
  in_RDI->topFrameWidth = (short)iVar2 - (short)iVar3;
  iVar2 = QRect::right((QRect *)0x49e09c);
  iVar3 = QRect::right((QRect *)0x49e0aa);
  in_RDI->rightFrameWidth = (short)iVar2 - (short)iVar3;
  iVar2 = QRect::bottom((QRect *)0x49e0d7);
  iVar3 = QRect::bottom((QRect *)0x49e0e5);
  in_RDI->bottomFrameWidth = (short)iVar2 - (short)iVar3;
  psVar6 = qMax<short>(&in_RDI->leftFrameWidth,&in_RDI->rightFrameWidth);
  b = qMax<short>(&in_RDI->topFrameWidth,&in_RDI->bottomFrameWidth);
  psVar6 = qMax<short>(psVar6,b);
  in_RDI->frameWidth = *psVar6;
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x49e154);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFramePrivate::updateStyledFrameWidths()
{
    Q_Q(const QFrame);
    QStyleOptionFrame opt;
    q->initStyleOption(&opt);

    QRect cr = q->style()->subElementRect(QStyle::SE_ShapedFrameContents, &opt, q);
    leftFrameWidth = cr.left() - opt.rect.left();
    topFrameWidth = cr.top() - opt.rect.top();
    rightFrameWidth = opt.rect.right() - cr.right(),
    bottomFrameWidth = opt.rect.bottom() - cr.bottom();
    frameWidth = qMax(qMax(leftFrameWidth, rightFrameWidth),
                      qMax(topFrameWidth, bottomFrameWidth));
}